

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O0

mraa_board_t * mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)

{
  int iVar1;
  mraa_result_t mVar2;
  void *pvVar3;
  int local_22c;
  int bus;
  int pin_index_scl;
  int pin_index_sda;
  mraa_pincapabilities_t local_21c;
  mraa_pincapabilities_t local_218;
  mraa_pincapabilities_t local_214;
  mraa_pincapabilities_t local_210;
  mraa_pincapabilities_t local_20c;
  mraa_pincapabilities_t local_208;
  mraa_pincapabilities_t local_204;
  mraa_pincapabilities_t local_200;
  mraa_pincapabilities_t local_1fc;
  mraa_pincapabilities_t local_1f8;
  mraa_pincapabilities_t local_1f4;
  mraa_pincapabilities_t local_1f0;
  mraa_pincapabilities_t local_1ec;
  mraa_pincapabilities_t local_1e8;
  mraa_pincapabilities_t local_1e4;
  mraa_pincapabilities_t local_1e0;
  mraa_pincapabilities_t local_1dc;
  mraa_pincapabilities_t local_1d8;
  mraa_pincapabilities_t local_1d4;
  mraa_pincapabilities_t local_1d0;
  mraa_pincapabilities_t local_1cc;
  mraa_pincapabilities_t local_1c8;
  mraa_pincapabilities_t local_1c4;
  mraa_pincapabilities_t local_1c0;
  mraa_pincapabilities_t local_1bc;
  mraa_pincapabilities_t local_1b8;
  mraa_pincapabilities_t local_1b4;
  int local_1b0;
  int local_1ac;
  int uname_minor;
  int uname_major;
  utsname running_uname;
  mraa_board_t *b;
  mraa_boolean_t turbot_local;
  
  running_uname.__domainname._57_8_ = calloc(1,0x5f0);
  if ((int *)running_uname.__domainname._57_8_ != (int *)0x0) {
    *(char **)(running_uname.__domainname._57_8_ + 0x4f8) = "MinnowBoard MAX";
    if (turbot == 0) {
      *(char **)(running_uname.__domainname._57_8_ + 0x500) = "Ax";
      *(int *)running_uname.__domainname._57_8_ = 0x1b;
      *(int *)(running_uname.__domainname._57_8_ + 4) = 0x1b;
    }
    else {
      *(char **)(running_uname.__domainname._57_8_ + 0x500) = "Turbot";
      *(int *)running_uname.__domainname._57_8_ = 0x1c;
      *(int *)(running_uname.__domainname._57_8_ + 4) = 0x1c;
    }
    *(int *)(running_uname.__domainname._57_8_ + 0x520) = 1;
    pvVar3 = calloc((long)*(int *)running_uname.__domainname._57_8_,0x2f4);
    *(void **)(running_uname.__domainname._57_8_ + 0x508) = pvVar3;
    if (*(long *)(running_uname.__domainname._57_8_ + 0x508) != 0) {
      pvVar3 = calloc(1,0x288);
      *(void **)(running_uname.__domainname._57_8_ + 0x510) = pvVar3;
      if (*(long *)(running_uname.__domainname._57_8_ + 0x510) == 0) {
        free(*(void **)(running_uname.__domainname._57_8_ + 0x508));
      }
      else {
        iVar1 = uname((utsname *)((long)&uname_minor + 2));
        if (iVar1 == 0) {
          __isoc99_sscanf(running_uname.nodename + 0x39,"%d.%d",&local_1ac,&local_1b0);
          if ((local_1ac < 4) && (local_1b0 < 0x12)) {
            arch_nr_gpios_adjust = 0;
          }
          local_1b4 = (mraa_pincapabilities_t)((uint)local_1b4 & 0xffffff00);
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0,"INVALID",local_1b4,-1,-1,
                     -1);
          local_1b8 = (mraa_pincapabilities_t)((uint)local_1b8 & 0xffffff00);
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,1,"GND",local_1b8,-1,-1,-1);
          local_1bc = (mraa_pincapabilities_t)((uint)local_1bc & 0xffffff00);
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,2,"GND",local_1bc,-1,-1,-1);
          local_1c0 = (mraa_pincapabilities_t)((uint)local_1c0 & 0xffffff00);
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,3,"5v",local_1c0,-1,-1,-1);
          local_1c4 = (mraa_pincapabilities_t)((uint)local_1c4 & 0xffffff00);
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,4,"3.3v",local_1c4,-1,-1,-1);
          local_1c8._0_1_ = 0x11;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,5,"SPI_CS",local_1c8,0xdc,0,
                     0x42);
          local_1cc._0_1_ = 0x81;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,6,"UART1TX",local_1cc,0xe1,0,
                     0x47);
          local_1d0._0_1_ = 0x11;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,7,"SPIMISO",local_1d0,0xdd,0,
                     0x43);
          local_1d4._0_1_ = 0x81;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,8,"UART1RX",local_1d4,0xe0,0,
                     0x46);
          local_1d8._0_1_ = 0x11;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,9,"SPIMOSI",local_1d8,0xde,0,
                     0x44);
          local_1dc._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,10,"UART1CT",local_1dc,0xe3,0
                     ,0x49);
          local_1e0._0_1_ = 0x11;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0xb,"SPI_CLK",local_1e0,0xdf,
                     0,0x45);
          local_1e4._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0xc,"UART1RT",local_1e4,0xe2,
                     0,0x48);
          local_1e8._0_1_ = 0x21;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0xd,"I2C_SCL",local_1e8,0xf3,
                     0,0x59);
          local_1ec._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0xe,"I2S_CLK",local_1ec,0xd8,
                     0,0x3e);
          local_1f0._0_1_ = 0x21;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0xf,"I2C_SDA",local_1f0,0xf2,
                     0,0x58);
          local_1f4._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x10,"I2S_FRM",local_1f4,0xd9
                     ,0,0x3f);
          local_1f8._0_1_ = 0x81;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x11,"UART2TX",local_1f8,0xe5
                     ,0,0x4b);
          local_1fc._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x12,"I2S_DO",local_1fc,0xdb,
                     0,0x41);
          local_200._0_1_ = 0x81;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x13,"UART2RX",local_200,0xe4
                     ,0,0x4a);
          local_204._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x14,"I2S_DI",local_204,0xda,
                     0,0x40);
          local_208._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x15,"S5_0",local_208,0x52,2,
                     0);
          local_20c._0_1_ = 5;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x16,"PWM0",local_20c,0xf8,0,
                     0x5e);
          local_210._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x17,"S5_1",local_210,0x53,2,
                     1);
          local_214._0_1_ = 5;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x18,"PWM1",local_214,0xf9,0,
                     0x5f);
          local_218._0_1_ = 3;
          mraa_intel_minnowboard_set_pininfo
                    ((mraa_board_t *)running_uname.__domainname._57_8_,0x19,"S5_4",local_218,0x54,2,
                     2);
          if (turbot == 0) {
            pin_index_scl = CONCAT31(pin_index_scl._1_3_,3);
            mraa_intel_minnowboard_set_pininfo
                      ((mraa_board_t *)running_uname.__domainname._57_8_,0x1a,"IBL8254",
                       (mraa_pincapabilities_t)pin_index_scl,0xd0,0,0x36);
          }
          else {
            local_21c._0_1_ = 3;
            mraa_intel_minnowboard_set_pininfo
                      ((mraa_board_t *)running_uname.__domainname._57_8_,0x1a,"I2S_MCLK",local_21c,
                       0xfd,0,99);
            pin_index_sda = CONCAT31(pin_index_sda._1_3_,3);
            mraa_intel_minnowboard_set_pininfo
                      ((mraa_board_t *)running_uname.__domainname._57_8_,0x1b,"D2_LED",
                       (mraa_pincapabilities_t)pin_index_sda,0x68,2,0x16);
          }
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0xc) = 1;
          mVar2 = mraa_intel_minnowboard_get_pin_index
                            ((mraa_board_t *)running_uname.__domainname._57_8_,"I2C_SDA",&bus);
          if ((mVar2 == MRAA_SUCCESS) &&
             (mVar2 = mraa_intel_minnowboard_get_pin_index
                                ((mraa_board_t *)running_uname.__domainname._57_8_,"I2C_SCL",
                                 &local_22c), mVar2 == MRAA_SUCCESS)) {
            iVar1 = mraa_find_i2c_bus("designware",0);
            if (iVar1 == -1) {
              *(undefined4 *)(running_uname.__domainname._57_8_ + 0xc) = 0;
            }
            else {
              *(int *)(running_uname.__domainname._57_8_ + 0x138) = iVar1;
              *(undefined4 *)(running_uname.__domainname._57_8_ + 0x20) =
                   *(undefined4 *)(running_uname.__domainname._57_8_ + 0x138);
              *(int *)(running_uname.__domainname._57_8_ + 0x28) = bus;
              *(int *)(running_uname.__domainname._57_8_ + 0x24) = local_22c;
            }
          }
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x4e8) = 500;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x4ec) = 1000000000;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x4f0) = 1;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x13c) = 1;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 800) = 0;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x148) = 0;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x14c) = 0;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x160) = 5;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x158) = 9;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x15c) = 7;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x154) = 0xb;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x338) = 1;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x32c) = 0;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x34c) = 0xffffffff;
          *(undefined4 *)(running_uname.__domainname._57_8_ + 0x350) = 0xffffffff;
          *(char **)(running_uname.__domainname._57_8_ + 0x360) = "/dev/ttyS0";
          return (mraa_board_t *)running_uname.__domainname._57_8_;
        }
        free(*(void **)(running_uname.__domainname._57_8_ + 0x508));
        free(*(void **)(running_uname.__domainname._57_8_ + 0x510));
      }
    }
    syslog(2,"minnowmax: Platform failed to initialise");
    free((void *)running_uname.__domainname._57_8_);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));

    struct utsname running_uname;
    int uname_major, uname_minor;

    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    if (turbot) {
        b->platform_version = "Turbot";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_TURBOT_PINCOUNT;
    } else {
        b->platform_version = "Ax";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_MAX_PINCOUNT;
    }
    b->chardev_capable = 1;

    b->pins = (mraa_pininfo_t*) calloc((size_t) b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    if (uname(&running_uname) != 0) {
        free(b->pins);
        free(b->adv_func);
        goto error;
    }

    sscanf(running_uname.release, "%d.%d", &uname_major, &uname_minor);

    /* if we are on Linux 3.17 or lower they use a 256 max and number the GPIOs down
     * if we are on 3.18 or higher (ea584595fc85e65796335033dfca25ed655cd0ed)  (for now)
     * they start at 512 and number down, at some point this is going to change again when
     * GPIO moves to a radix.
     */
    if (uname_major <= 3 && uname_minor <= 17) {
        arch_nr_gpios_adjust = 0;
    }

    mraa_intel_minnowboard_set_pininfo(b, 0, "INVALID", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 1, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 2, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 3, "5v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 4, "3.3v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 5, "SPI_CS", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 220, 0, 66);
    mraa_intel_minnowboard_set_pininfo(b, 6, "UART1TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 225, 0, 71);
    mraa_intel_minnowboard_set_pininfo(b, 7, "SPIMISO", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 221, 0, 67);
    mraa_intel_minnowboard_set_pininfo(b, 8, "UART1RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 224, 0, 70);
    mraa_intel_minnowboard_set_pininfo(b, 9, "SPIMOSI", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 222, 0, 68);
    mraa_intel_minnowboard_set_pininfo(b, 10, "UART1CT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 227, 0, 73);
    mraa_intel_minnowboard_set_pininfo(b, 11, "SPI_CLK", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 223, 0, 69);
    mraa_intel_minnowboard_set_pininfo(b, 12, "UART1RT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 226, 0, 72);
    mraa_intel_minnowboard_set_pininfo(b, 13, "I2C_SCL", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 243, 0, 89);
    mraa_intel_minnowboard_set_pininfo(b, 14, "I2S_CLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 216, 0, 62);
    mraa_intel_minnowboard_set_pininfo(b, 15, "I2C_SDA", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 242, 0, 88);
    mraa_intel_minnowboard_set_pininfo(b, 16, "I2S_FRM", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 217, 0, 63);
    mraa_intel_minnowboard_set_pininfo(b, 17, "UART2TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 229, 0, 75);
    mraa_intel_minnowboard_set_pininfo(b, 18, "I2S_DO", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 219, 0, 65);
    mraa_intel_minnowboard_set_pininfo(b, 19, "UART2RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 228, 0, 74);
    mraa_intel_minnowboard_set_pininfo(b, 20, "I2S_DI", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 218, 0, 64);
    mraa_intel_minnowboard_set_pininfo(b, 21, "S5_0", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 82, 2, 0);
    mraa_intel_minnowboard_set_pininfo(b, 22, "PWM0", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     248, 0, 94); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 23, "S5_1", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 83, 2, 1);
    mraa_intel_minnowboard_set_pininfo(b, 24, "PWM1", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     249, 0, 95); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 25, "S5_4", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 84, 2, 2);
    if (turbot) {
        mraa_intel_minnowboard_set_pininfo(b, 26, "I2S_MCLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 253, 0, 99);
        mraa_intel_minnowboard_set_pininfo(b, 27, "D2_LED", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 104, 2, 22);
    } else {
        mraa_intel_minnowboard_set_pininfo(b, 26, "IBL8254", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 208, 0, 54);
    }

    // Set number of i2c adaptors usable from userspace
    b->i2c_bus_count = 1;

    // Configure i2c adaptor #7 and make it the default
    int pin_index_sda, pin_index_scl;
    if (mraa_intel_minnowboard_get_pin_index(b, "I2C_SDA", &pin_index_sda) == MRAA_SUCCESS &&
        mraa_intel_minnowboard_get_pin_index(b, "I2C_SCL", &pin_index_scl) == MRAA_SUCCESS) {
        int bus = mraa_find_i2c_bus(I2CNAME, 0);
        if (bus == -1) {
            b->i2c_bus_count = 0;
        } else {
            b->def_i2c_bus = (unsigned int) bus;
            b->i2c_bus[0].bus_id = b->def_i2c_bus;
            b->i2c_bus[0].sda = pin_index_sda;
            b->i2c_bus[0].scl = pin_index_scl;
        }
    }

    // Configure PWM
    b->pwm_default_period = 500;
    b->pwm_max_period = 1000000000;
    b->pwm_min_period = 1;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 0;
    b->spi_bus[0].slave_s = 0;
    b->spi_bus[0].cs = 5;
    b->spi_bus[0].mosi = 9;
    b->spi_bus[0].miso = 7;
    b->spi_bus[0].sclk = 11;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = -1;
    b->uart_dev[0].tx = -1;
    b->uart_dev[0].device_path = "/dev/ttyS0";

    return b;
error:
    syslog(LOG_CRIT, "minnowmax: Platform failed to initialise");
    free(b);
    return NULL;
}